

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_2misc_64(DisasContext_conflict1 *s,int opcode,_Bool u,TCGv_i64 tcg_rd,TCGv_i64 tcg_rn,
                    TCGv_i32 tcg_rmode,TCGv_ptr tcg_fpstatus)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 arg2;
  TCGCond cond;
  code *func;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  
  tcg_ctx = s->uc->tcg_ctx;
  switch(opcode) {
  case 4:
    if (!u) {
      tcg_gen_clrsb_i64_aarch64(tcg_ctx,tcg_rd,tcg_rn);
      return;
    }
    tcg_gen_clzi_i64_aarch64(tcg_ctx,tcg_rd,tcg_rn,0x40);
    return;
  case 5:
    tcg_gen_not_i64_aarch64(tcg_ctx,tcg_rd,tcg_rn);
    return;
  case 6:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x1d:
switchD_006402bf_caseD_5d:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x2638,(char *)0x0);
  case 7:
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = tcg_rn + (long)tcg_ctx;
    if (u) {
      func = helper_neon_qneg_s64_aarch64;
    }
    else {
      func = helper_neon_qabs_s64_aarch64;
    }
    tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(tcg_rd + (long)tcg_ctx),2,&local_38);
    return;
  case 8:
    cond = (uint)!u * 8 + TCG_COND_GE;
    break;
  case 9:
    cond = (uint)u * 2 + TCG_COND_EQ;
    break;
  case 10:
    cond = TCG_COND_LT;
    break;
  case 0xb:
    if (!u) {
      tcg_gen_abs_i64_aarch64(tcg_ctx,tcg_rd,tcg_rn);
      return;
    }
    goto LAB_00640401;
  case 0x18:
  case 0x19:
switchD_006402bf_caseD_58:
    gen_helper_rintd(tcg_ctx,tcg_rd,tcg_rn,(TCGv_ptr)tcg_rmode);
    return;
  case 0x1a:
  case 0x1b:
  case 0x1c:
switchD_0064028c_caseD_1a:
    arg2 = tcg_const_i32_aarch64(tcg_ctx,0);
    gen_helper_vfp_tosqd(tcg_ctx,tcg_rd,tcg_rn,arg2,(TCGv_ptr)tcg_rmode);
    goto LAB_006402e2;
  case 0x1e:
switchD_006402bf_caseD_5e:
    gen_helper_frint32_d(tcg_ctx,tcg_rd,tcg_rn,(TCGv_ptr)tcg_rmode);
    return;
  case 0x1f:
switchD_006402bf_caseD_5f:
    gen_helper_frint64_d(tcg_ctx,tcg_rd,tcg_rn,(TCGv_ptr)tcg_rmode);
    return;
  default:
    switch(opcode) {
    case 0x58:
      goto switchD_006402bf_caseD_58;
    case 0x59:
      gen_helper_rintd_exact(tcg_ctx,tcg_rd,tcg_rn,(TCGv_ptr)tcg_rmode);
      return;
    case 0x5a:
    case 0x5b:
    case 0x5c:
      goto switchD_006402bf_caseD_5a;
    case 0x5d:
      goto switchD_006402bf_caseD_5d;
    case 0x5e:
      goto switchD_006402bf_caseD_5e;
    case 0x5f:
      goto switchD_006402bf_caseD_5f;
    default:
      if (opcode - 0x38U < 2) goto switchD_006402bf_caseD_58;
      if (opcode - 0x3aU < 2) goto switchD_0064028c_caseD_1a;
      if (1 < opcode - 0x7aU) {
        if (opcode == 0x2f) {
          gen_helper_vfp_absd(tcg_ctx,tcg_rd,tcg_rn);
          return;
        }
        if (opcode == 0x6f) {
          gen_helper_vfp_negd(tcg_ctx,tcg_rd,tcg_rn);
          return;
        }
        if (opcode != 0x79) {
          if (opcode == 0x7f) {
            gen_helper_vfp_sqrtd(tcg_ctx,tcg_rd,tcg_rn,tcg_ctx->cpu_env);
            return;
          }
          goto switchD_006402bf_caseD_5d;
        }
        goto switchD_006402bf_caseD_58;
      }
switchD_006402bf_caseD_5a:
      arg2 = tcg_const_i32_aarch64(tcg_ctx,0);
      gen_helper_vfp_touqd(tcg_ctx,tcg_rd,tcg_rn,arg2,(TCGv_ptr)tcg_rmode);
    }
LAB_006402e2:
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    return;
  }
  tcg_gen_setcondi_i64_aarch64(tcg_ctx,cond,tcg_rd,tcg_rn,0);
  tcg_rn = tcg_rd;
LAB_00640401:
  tcg_gen_neg_i64(tcg_ctx,tcg_rd,tcg_rn);
  return;
}

Assistant:

static void handle_2misc_64(DisasContext *s, int opcode, bool u,
                            TCGv_i64 tcg_rd, TCGv_i64 tcg_rn,
                            TCGv_i32 tcg_rmode, TCGv_ptr tcg_fpstatus)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Handle 64->64 opcodes which are shared between the scalar and
     * vector 2-reg-misc groups. We cover every integer opcode where size == 3
     * is valid in either group and also the double-precision fp ops.
     * The caller only need provide tcg_rmode and tcg_fpstatus if the op
     * requires them.
     */
    TCGCond cond;

    switch (opcode) {
    case 0x4: /* CLS, CLZ */
        if (u) {
            tcg_gen_clzi_i64(tcg_ctx, tcg_rd, tcg_rn, 64);
        } else {
            tcg_gen_clrsb_i64(tcg_ctx, tcg_rd, tcg_rn);
        }
        break;
    case 0x5: /* NOT */
        /* This opcode is shared with CNT and RBIT but we have earlier
         * enforced that size == 3 if and only if this is the NOT insn.
         */
        tcg_gen_not_i64(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x7: /* SQABS, SQNEG */
        if (u) {
            gen_helper_neon_qneg_s64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
        } else {
            gen_helper_neon_qabs_s64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
        }
        break;
    case 0xa: /* CMLT */
        /* 64 bit integer comparison against zero, result is
         * test ? (2^64 - 1) : 0. We implement via setcond(!test) and
         * subtracting 1.
         */
        cond = TCG_COND_LT;
    do_cmop:
        tcg_gen_setcondi_i64(tcg_ctx, cond, tcg_rd, tcg_rn, 0);
        tcg_gen_neg_i64(tcg_ctx, tcg_rd, tcg_rd);
        break;
    case 0x8: /* CMGT, CMGE */
        cond = u ? TCG_COND_GE : TCG_COND_GT;
        goto do_cmop;
    case 0x9: /* CMEQ, CMLE */
        cond = u ? TCG_COND_LE : TCG_COND_EQ;
        goto do_cmop;
    case 0xb: /* ABS, NEG */
        if (u) {
            tcg_gen_neg_i64(tcg_ctx, tcg_rd, tcg_rn);
        } else {
            tcg_gen_abs_i64(tcg_ctx, tcg_rd, tcg_rn);
        }
        break;
    case 0x2f: /* FABS */
        gen_helper_vfp_absd(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x6f: /* FNEG */
        gen_helper_vfp_negd(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x7f: /* FSQRT */
        gen_helper_vfp_sqrtd(tcg_ctx, tcg_rd, tcg_rn, tcg_ctx->cpu_env);
        break;
    case 0x1a: /* FCVTNS */
    case 0x1b: /* FCVTMS */
    case 0x1c: /* FCVTAS */
    case 0x3a: /* FCVTPS */
    case 0x3b: /* FCVTZS */
    {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
        gen_helper_vfp_tosqd(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_shift);
        break;
    }
    case 0x5a: /* FCVTNU */
    case 0x5b: /* FCVTMU */
    case 0x5c: /* FCVTAU */
    case 0x7a: /* FCVTPU */
    case 0x7b: /* FCVTZU */
    {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
        gen_helper_vfp_touqd(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_shift);
        break;
    }
    case 0x18: /* FRINTN */
    case 0x19: /* FRINTM */
    case 0x38: /* FRINTP */
    case 0x39: /* FRINTZ */
    case 0x58: /* FRINTA */
    case 0x79: /* FRINTI */
        gen_helper_rintd(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x59: /* FRINTX */
        gen_helper_rintd_exact(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x1e: /* FRINT32Z */
    case 0x5e: /* FRINT32X */
        gen_helper_frint32_d(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x1f: /* FRINT64Z */
    case 0x5f: /* FRINT64X */
        gen_helper_frint64_d(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    default:
        g_assert_not_reached();
    }
}